

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_bool nk_progress(nk_context *ctx,nk_size *cur,nk_size max,nk_bool is_modifyable)

{
  int iVar1;
  nk_window *pnVar2;
  nk_panel *pnVar3;
  ulong uVar4;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var5;
  nk_widget_layout_states nVar6;
  uint uVar7;
  nk_context *pnVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  int *piVar12;
  nk_command_buffer *b;
  bool bVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  nk_rect r;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect r_00;
  nk_rect rect_01;
  nk_rect rect_02;
  nk_rect bounds;
  nk_rect local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  nVar6 = NK_WIDGET_INVALID;
  if ((((ctx != (nk_context *)0x0) && (pnVar2 = ctx->current, pnVar2 != (nk_window *)0x0)) &&
      (pnVar3 = pnVar2->layout, cur != (nk_size *)0x0 && pnVar3 != (nk_panel *)0x0)) &&
     (nVar6 = nk_widget(&local_68,ctx), nVar6 != NK_WIDGET_INVALID)) {
    if (nVar6 == NK_WIDGET_ROM) {
      pnVar8 = (nk_context *)0x0;
    }
    else {
      pnVar8 = (nk_context *)0x0;
      if ((pnVar3->flags & 0x1000) == 0) {
        pnVar8 = ctx;
      }
    }
    uVar4 = *cur;
    fVar18 = local_68.w;
    fVar16 = local_68.h;
    fStack_44 = (ctx->style).progress.border;
    fVar20 = fStack_44 + (ctx->style).progress.padding.x;
    fStack_44 = (ctx->style).progress.padding.y + fStack_44;
    fVar17 = fVar20 + fVar20;
    fVar19 = fStack_44 + fStack_44;
    fVar14 = local_68.x;
    fVar15 = local_68.y;
    fVar23 = fVar17;
    if (fVar17 <= fVar18) {
      fVar23 = fVar18;
    }
    local_48 = fVar19;
    if (fVar19 <= fVar16) {
      local_48 = fVar16;
    }
    fVar22 = (float)max;
    fVar20 = fVar20 + fVar14;
    fVar21 = fStack_44 + fVar15;
    fVar23 = fVar23 - fVar17;
    local_48 = local_48 - fVar19;
    if (uVar4 < max) {
      max = uVar4;
    }
    uVar9 = ctx->last_widget_state & 2 | 4;
    ctx->last_widget_state = uVar9;
    rect_02.y = fVar21;
    rect_02.x = fVar20;
    if ((is_modifyable != 0) && (pnVar8 != (nk_context *)0x0)) {
      iVar1 = (pnVar8->input).mouse.buttons[0].down;
      fVar17 = (pnVar8->input).mouse.buttons[0].clicked_pos.x;
      bVar13 = false;
      if ((fVar20 <= fVar17) && (bVar13 = false, fVar17 < fVar20 + fVar23)) {
        fVar17 = (pnVar8->input).mouse.buttons[0].clicked_pos.y;
        bVar13 = iVar1 == 1 && (fVar17 < fVar21 + local_48 && fVar21 <= fVar17);
      }
      fVar17 = (pnVar8->input).mouse.pos.x;
      fVar18 = fVar14 + fVar18;
      if (((fVar14 <= fVar17) && (fVar17 < fVar18)) &&
         ((fVar19 = (pnVar8->input).mouse.pos.y, fVar15 <= fVar19 && (fVar19 < fVar15 + fVar16)))) {
        ctx->last_widget_state = 0x12;
        uVar9 = 0x12;
      }
      if (bVar13 && iVar1 != 0) {
        fVar17 = fVar17 - fVar20;
        if (fVar17 <= 0.0) {
          fVar17 = 0.0;
        }
        fVar19 = (fVar17 / fVar23) * fVar22;
        fVar17 = 0.0;
        if (0.0 <= fVar19) {
          fVar17 = fVar19;
        }
        fVar17 = (float)(~-(uint)(fVar19 < fVar22) & (uint)fVar22 |
                        (uint)fVar17 & -(uint)(fVar19 < fVar22));
        uVar10 = (ulong)fVar17;
        max = (long)(fVar17 - 9.223372e+18) & (long)uVar10 >> 0x3f | uVar10;
        (pnVar8->input).mouse.buttons[0].clicked_pos.x = fVar23 * 0.5 + fVar20;
        uVar9 = uVar9 | 0x22;
        ctx->last_widget_state = uVar9;
      }
      fVar17 = (pnVar8->input).mouse.prev.x;
      if ((((uVar9 & 0x10) != 0) &&
          ((((uVar7 = 8, fVar17 < fVar14 || (fVar18 <= fVar17)) ||
            (fVar19 = (pnVar8->input).mouse.prev.y, fVar19 < fVar15)) || (fVar15 + fVar16 <= fVar19)
           ))) || (((fVar14 <= fVar17 && (fVar17 < fVar18)) &&
                   ((fVar14 = (pnVar8->input).mouse.prev.y, fVar15 <= fVar14 &&
                    (uVar7 = 0x40, fVar14 < fVar15 + fVar16)))))) {
        uVar9 = uVar9 | uVar7;
        ctx->last_widget_state = uVar9;
      }
    }
    b = &pnVar2->buffer;
    p_Var5 = (ctx->style).progress.draw_begin;
    fStack_40 = fStack_44;
    fStack_3c = fStack_44;
    if (p_Var5 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      local_58 = CONCAT44(fStack_44,fVar23);
      uStack_50 = 0;
      (*p_Var5)(b,(nk_handle)(ctx->style).progress.userdata.ptr);
      uVar9 = ctx->last_widget_state;
      fVar23 = (float)local_58;
    }
    uVar7 = uVar9 * 2 & 0x20;
    bVar13 = (uVar9 & 0x20) == 0;
    lVar11 = 0xa8;
    if (bVar13) {
      lVar11 = (ulong)uVar7 + 0x68;
    }
    fVar23 = ((float)uVar4 / fVar22) * fVar23;
    uVar10 = 0x40;
    if (bVar13) {
      uVar10 = (ulong)uVar7;
    }
    piVar12 = (int *)((long)&(ctx->style).progress.normal.type + lVar11);
    if (*(int *)((long)&(ctx->style).progress.normal.type + uVar10) == 0) {
      rect.w = local_68.w;
      rect.h = local_68.h;
      rect.x = local_68.x;
      rect.y = local_68.y;
      nk_fill_rect(b,rect,(ctx->style).progress.rounding,
                   *(nk_color *)((long)&(ctx->style).progress.normal.data + uVar10));
      rect_00.w = local_68.w;
      rect_00.h = local_68.h;
      rect_00.x = local_68.x;
      rect_00.y = local_68.y;
      nk_stroke_rect(b,rect_00,(ctx->style).progress.rounding,(ctx->style).progress.border,
                     (ctx->style).progress.border_color);
    }
    else {
      r.w = local_68.w;
      r.h = local_68.h;
      r.x = local_68.x;
      r.y = local_68.y;
      nk_draw_image(b,r,(nk_image *)((long)&(ctx->style).progress.normal.data + uVar10),
                    (nk_color)0xffffffff);
    }
    fVar14 = local_48;
    if (*piVar12 == 0) {
      rect_01.h = local_48;
      rect_01.w = fVar23;
      rect_01.x = fVar20;
      rect_01.y = fVar21;
      nk_fill_rect(b,rect_01,(ctx->style).progress.rounding,*(nk_color *)(piVar12 + 2));
      rect_02.h = fVar14;
      rect_02.w = fVar23;
      nk_stroke_rect(b,rect_02,(ctx->style).progress.rounding,(ctx->style).progress.border,
                     (ctx->style).progress.border_color);
    }
    else {
      r_00.h = local_48;
      r_00.w = fVar23;
      r_00.x = fVar20;
      r_00.y = fVar21;
      nk_draw_image(b,r_00,(nk_image *)(piVar12 + 2),(nk_color)0xffffffff);
    }
    p_Var5 = (ctx->style).progress.draw_end;
    if (p_Var5 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      (*p_Var5)(b,(nk_handle)(ctx->style).progress.userdata.ptr);
    }
    *cur = max;
    nVar6 = (nk_widget_layout_states)(max != uVar4);
  }
  return nVar6;
}

Assistant:

NK_API nk_bool
nk_progress(struct nk_context *ctx, nk_size *cur, nk_size max, nk_bool is_modifyable)
{
struct nk_window *win;
struct nk_panel *layout;
const struct nk_style *style;
struct nk_input *in;

struct nk_rect bounds;
enum nk_widget_layout_states state;
nk_size old_value;

NK_ASSERT(ctx);
NK_ASSERT(cur);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout || !cur)
return 0;

win = ctx->current;
style = &ctx->style;
layout = win->layout;
state = nk_widget(&bounds, ctx);
if (!state) return 0;

in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
old_value = *cur;
*cur = nk_do_progress(&ctx->last_widget_state, &win->buffer, bounds,
*cur, max, is_modifyable, &style->progress, in);
return (*cur != old_value);
}